

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_routing.c
# Opt level: O3

void olsrv2_routing_force_update(_Bool skip_wait)

{
  nhdp_domain *domain;
  nhdp_neighbor *first_hop;
  byte bVar1;
  uint pathcost;
  uint uVar2;
  _Bool _Var3;
  _Bool _Var4;
  int iVar5;
  long *plVar6;
  long lVar7;
  list_entity *plVar8;
  undefined8 *puVar9;
  netaddr *pnVar10;
  avl_tree *paVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  long lVar14;
  list_entity *plVar15;
  long *plVar16;
  long *plVar17;
  ulong uVar18;
  list_entity **pplVar19;
  byte bVar20;
  os_route_str rbuf1;
  undefined1 local_192 [354];
  
  bVar20 = 0;
  if ((_initiate_shutdown == '\0') && (!_freeze_routes)) {
    if (_rate_limit_timer._clock != 0) {
      if (!skip_wait) {
        _trigger_dijkstra = 1;
        if (((&log_global_mask)[LOG_OLSRV2_ROUTING] & 1) == 0) {
          _trigger_dijkstra = 1;
          return;
        }
        oonf_log(1,(ulong)LOG_OLSRV2_ROUTING,"src/olsrv2/olsrv2/olsrv2_routing.c",0x13e,0,0,
                 "Delay Dijkstra");
        return;
      }
      oonf_timer_stop(&_rate_limit_timer);
    }
    uVar18 = (ulong)LOG_OLSRV2_ROUTING;
    if (_update_ansn == true) {
      _ansn = _ansn + 1;
      _update_ansn = false;
      if (((&log_global_mask)[uVar18] & 1) != 0) {
        oonf_log(1,uVar18,"src/olsrv2/olsrv2/olsrv2_routing.c",0x147,0,0,"Update ANSN to %u",_ansn);
        uVar18 = (ulong)LOG_OLSRV2_ROUTING;
      }
    }
    if (((&log_global_mask)[uVar18] & 1) != 0) {
      oonf_log(1,uVar18,"src/olsrv2/olsrv2/olsrv2_routing.c",0x14a,0,0,"Run Dijkstra");
    }
    plVar6 = (long *)nhdp_domain_get_list();
    plVar6 = (long *)*plVar6;
    lVar14 = plVar6[1];
    lVar7 = nhdp_domain_get_list();
    if (lVar14 != *(long *)(lVar7 + 8)) {
      do {
        if (_domain_changed[*(int *)((long)plVar6 + -0x26c)] == true) {
          _domain_changed[*(int *)((long)plVar6 + -0x26c)] = false;
          plVar8 = _routing_tree[*(int *)((long)plVar6 + -0x26c)].list_head.next;
          if (plVar8->prev != _routing_tree[*(int *)((long)plVar6 + -0x26c)].list_head.prev) {
            do {
              *(undefined1 *)((long)&plVar8[-8].prev + 3) = 0;
              pplVar19 = &plVar8[-0x17].prev;
              plVar15 = plVar8 + -7;
              for (lVar14 = 0xb; lVar14 != 0; lVar14 = lVar14 + -1) {
                plVar15->next = *pplVar19;
                pplVar19 = pplVar19 + (ulong)bVar20 * -2 + 1;
                plVar15 = (list_entity *)&plVar15[-(ulong)bVar20].prev;
              }
              *(undefined4 *)&plVar8[-2].prev = *(undefined4 *)&plVar8[-0x11].next;
              plVar8 = plVar8->next;
            } while (plVar8->prev != _routing_tree[*(int *)((long)plVar6 + -0x26c)].list_head.prev);
          }
          domain = (nhdp_domain *)(plVar6 + -0x54);
          _prepare_nodes();
          _Var3 = _check_ssnode_split(domain,2);
          _run_dijkstra(domain,2,true,!_Var3);
          _Var4 = _check_ssnode_split(domain,10);
          _run_dijkstra(domain,10,true,!_Var4);
          if (_Var3 || _Var4) {
            _prepare_nodes();
            if (_Var3) {
              _run_dijkstra(domain,2,false,true);
            }
            if (_Var4) {
              _run_dijkstra(domain,10,false,true);
            }
          }
          puVar9 = (undefined8 *)nhdp_db_get_neigh_list();
          for (puVar9 = (undefined8 *)*puVar9; lVar14 = puVar9[1], lVar7 = nhdp_db_get_neigh_list(),
              lVar14 != *(long *)(lVar7 + 8); puVar9 = (undefined8 *)*puVar9) {
            if ((*(int *)((long)puVar9 + -0x84) != 0) &&
               (pathcost = *(uint *)((long)puVar9 +
                                    (long)*(int *)((long)plVar6 + -0x26c) * 0x20 + 0x4c),
               pathcost < 0xffff01)) {
              first_hop = (nhdp_neighbor *)(puVar9 + -0x13);
              plVar16 = (long *)puVar9[-10];
              if (plVar16[1] != puVar9[-9]) {
                bVar1 = *(byte *)(puVar9 + -0x11);
                do {
                  _Var3 = olsrv2_is_nhdp_routable((netaddr *)(plVar16 + -0x11));
                  if (_Var3) {
                    pnVar10 = olsrv2_originator_get((uint)bVar1);
                    if (pnVar10 == (netaddr *)0x0) {
                      pnVar10 = (netaddr *)&NETADDR_UNSPEC;
                    }
                    os_routing_generic_init_half_os_route_key
                              (rbuf1.buf + 0x12,(os_route_key *)&rbuf1,(netaddr *)(plVar16 + -0x11))
                    ;
                    _update_routing_entry
                              (domain,(os_route_key *)&rbuf1,pnVar10,first_hop,'\0',pathcost,'\x01',
                               true,pnVar10);
                  }
                  plVar16 = (long *)*plVar16;
                } while (plVar16[1] != puVar9[-9]);
              }
              plVar16 = (long *)puVar9[-0xc];
              lVar14 = puVar9[-0xb];
              if (plVar16[1] != lVar14) {
                do {
                  plVar17 = (long *)plVar16[-9];
                  lVar7 = plVar16[-8];
                  if (plVar17[1] != lVar7) {
                    do {
                      if ((plVar17[-1] == 0) &&
                         (uVar2 = *(uint *)((long)plVar17 +
                                           (long)*(int *)((long)plVar6 + -0x26c) * 0xc + 0x74),
                         uVar2 < 0xffff01)) {
                        os_routing_generic_init_half_os_route_key
                                  (rbuf1.buf + 0x12,(os_route_key *)&rbuf1,plVar17 + -0x10);
                        _update_routing_entry
                                  (domain,(os_route_key *)&rbuf1,(netaddr *)&NETADDR_UNSPEC,
                                   first_hop,'\0',uVar2 + pathcost,'\x02',false,(netaddr *)first_hop
                                  );
                        lVar7 = plVar16[-8];
                      }
                      plVar17 = (long *)*plVar17;
                    } while (plVar17[1] != lVar7);
                    lVar14 = puVar9[-0xb];
                  }
                  plVar16 = (long *)*plVar16;
                } while (plVar16[1] != lVar14);
              }
            }
          }
          plVar8 = _routing_tree[*(int *)((long)plVar6 + -0x26c)].list_head.next;
          if (plVar8->prev != _routing_tree[*(int *)((long)plVar6 + -0x26c)].list_head.prev) {
            do {
              plVar15 = plVar8[-0xc].prev;
              *(char *)((long)&plVar8[-0x12].prev + 4) =
                   (char)_domain_parameter[*(int *)((long)&plVar15[3].next + 4)].table;
              *(char *)((long)&plVar8[-0x12].prev + 5) =
                   (char)_domain_parameter[*(int *)((long)&plVar15[3].next + 4)].protocol;
              *(int *)&plVar8[-0x12].prev =
                   _domain_parameter[*(int *)((long)&plVar15[3].next + 4)].distance;
              if (((*(char *)((long)&plVar8[-8].prev + 3) == '\x01') &&
                  (_domain_parameter[*(int *)((long)&plVar15[3].next + 4)].use_srcip_in_routes ==
                   true)) && (*(char *)&plVar8[-0x15].next == '\x02')) {
                pnVar10 = olsrv2_originator_get(2);
                uVar12 = *(undefined8 *)(pnVar10->_addr + 8);
                *(undefined8 *)((long)&plVar8[-0x13].next + 6) = *(undefined8 *)pnVar10->_addr;
                *(undefined8 *)((long)&plVar8[-0x13].prev + 6) = uVar12;
                *(undefined2 *)((long)&plVar8[-0x12].next + 6) = *(undefined2 *)&pnVar10->_type;
              }
              paVar11 = olsrv2_lan_get_tree();
              lVar14 = avl_find(paVar11,plVar8 + -0x16);
              if (((lVar14 != 0) &&
                  (*(char *)(lVar14 + 0x41 + (long)*(int *)((long)plVar6 + -0x26c) * 8) == '\x01'))
                 && (*(uint *)(lVar14 + 0x3c + (long)*(int *)((long)plVar6 + -0x26c) * 8) <
                     *(uint *)&plVar8[-0xb].next)) {
                *(undefined1 *)((long)&plVar8[-8].prev + 3) = 0;
              }
              pplVar19 = &plVar8[-0x17].prev;
              for (plVar15 = _routing_filter_list.next; plVar15->prev != _routing_filter_list.prev;
                  plVar15 = plVar15->next) {
                (*(code *)plVar15[-1].prev)
                          (domain,pplVar19,*(undefined1 *)((long)&plVar8[-8].prev + 3));
              }
              if (*(char *)((long)&plVar8[-8].prev + 3) == '\x01') {
                iVar5 = bcmp(plVar8 + -7,pplVar19,0x5c);
                if (iVar5 != 0) goto LAB_001073b7;
                uVar18 = (ulong)LOG_OLSRV2_ROUTING;
                if (((&log_global_mask)[uVar18] & 2) != 0) {
                  uVar12 = os_routing_generic_rt_to_string(&rbuf1,plVar8 + -7);
                  uVar13 = os_routing_generic_rt_to_string(local_192,pplVar19);
                  oonf_log(2,uVar18,"src/olsrv2/olsrv2/olsrv2_routing.c",0x446,0,0,
                           "Ignore route change: %s -> %s",uVar12,uVar13);
                }
              }
              else {
LAB_001073b7:
                _add_route_to_kernel_queue((olsrv2_routing_entry *)pplVar19);
              }
              plVar8 = plVar8->next;
            } while (plVar8->prev != _routing_tree[*(int *)((long)plVar6 + -0x26c)].list_head.prev);
          }
        }
        plVar6 = (long *)*plVar6;
        lVar14 = plVar6[1];
        lVar7 = nhdp_domain_get_list();
      } while (lVar14 != *(long *)(lVar7 + 8));
    }
    _process_kernel_queue();
    oonf_timer_set_ext(&_rate_limit_timer,1000,1000);
  }
  return;
}

Assistant:

void
olsrv2_routing_force_update(bool skip_wait) {
  struct nhdp_domain *domain;
  bool splitv4, splitv6;

  if (_initiate_shutdown || _freeze_routes) {
    /* no dijkstra anymore when in shutdown */
    return;
  }

  /* handle dijkstra rate limitation timer */
  if (oonf_timer_is_active(&_rate_limit_timer)) {
    if (!skip_wait) {
      /* trigger dijkstra later */
      _trigger_dijkstra = true;

      OONF_DEBUG(LOG_OLSRV2_ROUTING, "Delay Dijkstra");
      return;
    }
    oonf_timer_stop(&_rate_limit_timer);
  }

  if (_update_ansn) {
    _ansn++;
    _update_ansn = false;
    OONF_DEBUG(LOG_OLSRV2_ROUTING, "Update ANSN to %u", _ansn);
  }

  OONF_DEBUG(LOG_OLSRV2_ROUTING, "Run Dijkstra");

  list_for_each_element(nhdp_domain_get_list(), domain, _node) {
    /* check if dijkstra is necessary */
    if (!_domain_changed[domain->index]) {
      /* nothing to do for this domain */
      continue;
    }
    _domain_changed[domain->index] = false;

    /* initialize dijkstra specific fields */
    _prepare_routes(domain);
    _prepare_nodes();

    /* run IPv4 dijkstra (might be two times because of source-specific data) */
    splitv4 = _check_ssnode_split(domain, AF_INET);
    _run_dijkstra(domain, AF_INET, true, !splitv4);

    /* run IPv6 dijkstra (might be two times because of source-specific data) */
    splitv6 = _check_ssnode_split(domain, AF_INET6);
    _run_dijkstra(domain, AF_INET6, true, !splitv6);

    /* handle source-specific sub-topology if necessary */
    if (splitv4 || splitv6) {
      /* re-initialize dijkstra specific node fields */
      _prepare_nodes();

      if (splitv4) {
        _run_dijkstra(domain, AF_INET, false, true);
      }
      if (splitv6) {
        _run_dijkstra(domain, AF_INET6, false, true);
      }
    }

    /* check if direct one-hop routes are quicker */
    _handle_nhdp_routes(domain);

    /* update kernel routes */
    _process_dijkstra_result(domain);
  }

  _process_kernel_queue();

  /* make sure dijkstra is not called too often */
  oonf_timer_set(&_rate_limit_timer, OLSRv2_DIJKSTRA_RATE_LIMITATION);
}